

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Vacuum(Parse *pParse,Token *pNm,Expr *pInto)

{
  int p1;
  int iVar1;
  Vdbe *p;
  int target;
  Token *pTStack_38;
  
  p = sqlite3GetVdbe(pParse);
  if ((p != (Vdbe *)0x0) && (pParse->nErr == 0)) {
    target = 0;
    p1 = 0;
    if (pNm != (Token *)0x0) {
      p1 = sqlite3TwoPartName(pParse,pNm,pNm,&pTStack_38);
      if (p1 == 1 || p1 < 0) goto LAB_00160b7e;
    }
    if (pInto != (Expr *)0x0) {
      target = 0;
      iVar1 = sqlite3ResolveSelfReference(pParse,(Table *)0x0,0,pInto,(ExprList *)0x0);
      if (iVar1 == 0) {
        target = pParse->nMem + 1;
        pParse->nMem = target;
        sqlite3ExprCode(pParse,pInto,target);
      }
    }
    sqlite3VdbeAddOp2(p,5,p1,target);
    sqlite3VdbeUsesBtree(p,p1);
  }
LAB_00160b7e:
  sqlite3ExprDelete(pParse->db,pInto);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Vacuum(Parse *pParse, Token *pNm, Expr *pInto){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int iDb = 0;
  if( v==0 ) goto build_vacuum_end;
  if( pParse->nErr ) goto build_vacuum_end;
  if( pNm ){
#ifndef SQLITE_BUG_COMPATIBLE_20160819
    /* Default behavior:  Report an error if the argument to VACUUM is
    ** not recognized */
    iDb = sqlite3TwoPartName(pParse, pNm, pNm, &pNm);
    if( iDb<0 ) goto build_vacuum_end;
#else
    /* When SQLITE_BUG_COMPATIBLE_20160819 is defined, unrecognized arguments
    ** to VACUUM are silently ignored.  This is a back-out of a bug fix that
    ** occurred on 2016-08-19 (https://www.sqlite.org/src/info/083f9e6270).
    ** The buggy behavior is required for binary compatibility with some
    ** legacy applications. */
    iDb = sqlite3FindDb(pParse->db, pNm);
    if( iDb<0 ) iDb = 0;
#endif
  }
  if( iDb!=1 ){
    int iIntoReg = 0;
    if( pInto && sqlite3ResolveSelfReference(pParse,0,0,pInto,0)==0 ){
      iIntoReg = ++pParse->nMem;
      sqlite3ExprCode(pParse, pInto, iIntoReg);
    }
    sqlite3VdbeAddOp2(v, OP_Vacuum, iDb, iIntoReg);
    sqlite3VdbeUsesBtree(v, iDb);
  }
build_vacuum_end:
  sqlite3ExprDelete(pParse->db, pInto);
  return;
}